

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  ImGuiTableColumn *pIVar5;
  bool *in_RDI;
  float column_n_00;
  ImGuiID unaff_retaddr;
  bool pressed;
  bool held;
  bool hovered;
  ImRect *in_stack_00000008;
  ImRect hit_rect;
  ImGuiID column_id;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float hit_y2;
  float hit_y2_full;
  float hit_y1;
  float hit_half_width;
  bool borders_full_height;
  ImGuiContext *g;
  int in_stack_ffffffffffffffa8;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffb1;
  byte in_stack_ffffffffffffffb2;
  byte in_stack_ffffffffffffffb3;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  ImGuiID in_stack_ffffffffffffffc4;
  int local_28;
  undefined4 in_stack_ffffffffffffffec;
  uint flags;
  ImGuiContext *out_held;
  
  out_held = GImGui;
  if ((*(uint *)(in_RDI + 4) & 1) == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x221f,"TableUpdateBorders","ImGui ASSERT FAILED: %s",
                "table->Flags & ImGuiTableFlags_Resizable");
  }
  uVar6 = true;
  if ((in_RDI[0x1d7] & 1U) != 0) {
    uVar6 = (*(uint *)(in_RDI + 4) & 0x800) != 0;
  }
  flags = CONCAT13(uVar6,(int3)in_stack_ffffffffffffffec);
  fVar1 = *(float *)(in_RDI + 0xe8);
  column_n_00 = ImMax<float>(*(float *)(in_RDI + 0xf0),fVar1 + *(float *)(in_RDI + 200));
  if ((flags & 0x1000000) == 0) {
    column_n_00 = fVar1 + *(float *)(in_RDI + 0xcc);
  }
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x6c); local_28 = local_28 + 1) {
    if ((*(ulong *)(in_RDI + 0x50) & 1L << ((byte)local_28 & 0x3f)) != 0) {
      pcVar4 = ImSpan<signed_char>::operator[]
                         ((ImSpan<signed_char> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (int)in_stack_ffffffffffffffbc);
      bVar2 = (bool)*pcVar4;
      pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (int)in_stack_ffffffffffffffbc);
      if ((pIVar5->Flags & 0x100020U) == 0) {
        in_stack_ffffffffffffffc4 =
             TableGetColumnResizeID
                       ((ImGuiTable *)
                        CONCAT44(in_stack_ffffffffffffffb4,
                                 CONCAT13(in_stack_ffffffffffffffb3,
                                          CONCAT12(in_stack_ffffffffffffffb2,
                                                   CONCAT11(in_stack_ffffffffffffffb1,uVar6)))),
                        (int)column_n_00,in_stack_ffffffffffffffa8);
        ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4
                       ,(float)CONCAT13(in_stack_ffffffffffffffb3,
                                        CONCAT12(in_stack_ffffffffffffffb2,
                                                 CONCAT11(in_stack_ffffffffffffffb1,uVar6))));
        KeepAliveID(in_stack_ffffffffffffffc4);
        in_stack_ffffffffffffffb3 = 0;
        in_stack_ffffffffffffffb2 = 0;
        in_stack_ffffffffffffffb1 =
             ButtonBehavior(in_stack_00000008,unaff_retaddr,in_RDI,&out_held->Initialized,flags);
        if ((((bool)in_stack_ffffffffffffffb1) &&
            (bVar3 = IsMouseDoubleClicked((ImGuiMouseButton)in_stack_ffffffffffffffb4), bVar3)) &&
           ((pIVar5->Flags & 8U) == 0)) {
          TableSetColumnAutofit
                    ((ImGuiTable *)
                     CONCAT44(in_stack_ffffffffffffffb4,
                              CONCAT13(in_stack_ffffffffffffffb3,
                                       CONCAT12(in_stack_ffffffffffffffb2,
                                                CONCAT11(in_stack_ffffffffffffffb1,uVar6)))),
                     (int)column_n_00);
          ClearActiveID();
          in_stack_ffffffffffffffb3 = 0;
          in_stack_ffffffffffffffb2 = 0;
        }
        if ((in_stack_ffffffffffffffb2 & 1) != 0) {
          in_RDI[0x1c4] = bVar2;
          *(undefined2 *)(in_RDI + 0x7e) = *(undefined2 *)(in_RDI + 0x7c);
        }
        if ((((in_stack_ffffffffffffffb3 & 1) != 0) && (0.06 < out_held->HoveredIdTimer)) ||
           ((in_stack_ffffffffffffffb2 & 1) != 0)) {
          in_RDI[0x1c3] = bVar2;
          SetMouseCursor(4);
        }
      }
    }
  }
  return;
}

Assistant:

void    ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    const bool borders_full_height = (table->IsUsingHeaders == false) || (table->Flags & ImGuiTableFlags_BordersFullHeightV);
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_full = ImMax(table->OuterRect.Max.y, hit_y1 + table->LastOuterHeight);
    const float hit_y2 = borders_full_height ? hit_y2_full : (hit_y1 + table->LastFirstRowHeight);

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, hit_y2);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));
        KeepAliveID(column_id);

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick);
        if (pressed && IsMouseDoubleClicked(0) && !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
        {
            // FIXME-TABLE: Double-clicking on column edge could auto-fit Stretch column?
            TableSetColumnAutofit(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            table->ResizedColumn = (ImS8)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImS8)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}